

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O3

void __thiscall QTextEdit::scrollToAnchor(QTextEdit *this,QString *name)

{
  QTextEditPrivate *this_00;
  int iVar1;
  int value;
  QPointF QVar2;
  
  if ((name->d).size == 0) {
    return;
  }
  this_00 = *(QTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  if ((((this->super_QAbstractScrollArea).super_QFrame.super_QWidget.data)->widget_attributes &
      0x8000) == 0) {
    QString::operator=(&this_00->anchorToScrollToWhenVisible,(QString *)name);
    return;
  }
  QVar2 = QWidgetTextControl::anchorPosition((QWidgetTextControl *)this_00->control,name);
  value = (int)((double)((ulong)QVar2.yp & 0x8000000000000000 | (ulong)DAT_006605c0) + QVar2.yp);
  iVar1 = QAbstractSlider::maximum
                    (&((this_00->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider);
  if (iVar1 < value) {
    QTextEditPrivate::adjustScrollbars(this_00);
  }
  QAbstractSlider::setValue
            (&((this_00->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,value);
  return;
}

Assistant:

constexpr bool isEmpty() const noexcept { return size() == 0; }